

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O3

string * __thiscall
cmMakefileTargetGenerator::CreateResponseFile
          (string *__return_storage_ptr__,cmMakefileTargetGenerator *this,string *name,
          string *options,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *makefile_depends,string *language)

{
  cmMakefile *this_00;
  bool bVar1;
  Encoding encoding;
  int iVar2;
  ostream *poVar3;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  string responseFileNameFull;
  cmGeneratedFileStream responseStream;
  string local_338;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  pointer local_2e0;
  undefined8 local_2d8;
  undefined1 local_2d0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2b0;
  undefined8 local_2a8;
  size_type local_2a0;
  pointer local_298;
  undefined8 local_290;
  undefined8 local_68;
  undefined8 local_60;
  undefined1 *local_58;
  undefined1 local_50 [32];
  
  encoding = (*(this->GlobalGenerator->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
               _vptr_cmGlobalGenerator[5])();
  if (encoding == UTF8_WITH_BOM) {
    iVar2 = std::__cxx11::string::compare((char *)language);
    if (iVar2 != 0) {
      this_00 = (this->super_cmCommonTargetGenerator).Makefile;
      local_2d0._0_8_ = &local_2c0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2d0,"MSVC","");
      bVar1 = cmMakefile::IsOn(this_00,(string *)local_2d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._0_8_ != &local_2c0) {
        operator_delete((void *)local_2d0._0_8_,local_2c0._M_allocated_capacity + 1);
      }
      encoding = UTF8_WITH_BOM;
      if (bVar1) goto LAB_0066b43f;
    }
    encoding = UTF8;
  }
LAB_0066b43f:
  local_2d0._8_8_ = (this->TargetBuildDirectoryFull)._M_dataplus._M_p;
  local_2d0._0_8_ = (this->TargetBuildDirectoryFull)._M_string_length;
  local_2c0._M_allocated_capacity = 0;
  local_318.second = &local_300;
  local_318.first._M_len = 0;
  local_318.first._M_str = (char *)0x1;
  local_300._M_dataplus._M_p._0_1_ = 0x2f;
  local_2c0._8_8_ = 1;
  local_2a8 = 0;
  local_298 = (name->_M_dataplus)._M_p;
  local_2a0 = name->_M_string_length;
  local_290 = 0;
  views._M_len = 3;
  views._M_array = (iterator)local_2d0;
  local_2b0 = local_318.second;
  cmCatViews(&local_338,views);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_2d0,&local_338,false,encoding);
  cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_2d0,true);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_2d0,(options->_M_dataplus)._M_p,options->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)makefile_depends,
             &local_338);
  local_318.first._M_str = (this->TargetBuildDirectory)._M_dataplus._M_p;
  local_318.first._M_len = (this->TargetBuildDirectory)._M_string_length;
  local_318.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_300._M_string_length = (size_type)local_50;
  local_68 = 0;
  local_60 = 1;
  local_50[0] = 0x2f;
  local_300._M_dataplus._M_p = (pointer)0x1;
  local_300.field_2._M_allocated_capacity = 0;
  local_2e0 = (name->_M_dataplus)._M_p;
  local_300.field_2._8_8_ = name->_M_string_length;
  local_2d8 = 0;
  views_00._M_len = 3;
  views_00._M_array = &local_318;
  local_58 = (undefined1 *)local_300._M_string_length;
  cmCatViews(__return_storage_ptr__,views_00);
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != &local_338.field_2) {
    operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmMakefileTargetGenerator::CreateResponseFile(
  const std::string& name, std::string const& options,
  std::vector<std::string>& makefile_depends, std::string const& language)
{
  // FIXME: Find a better way to determine the response file encoding,
  // perhaps using tool-specific platform information variables.
  // For now, use the makefile encoding as a heuristic.
  codecvt_Encoding responseEncoding =
    this->GlobalGenerator->GetMakefileEncoding();
  // Non-MSVC tooling doesn't understand BOM encoded files.
  if (responseEncoding == codecvt_Encoding::UTF8_WITH_BOM &&
      (language == "CUDA" || !this->Makefile->IsOn("MSVC"))) {
    responseEncoding = codecvt_Encoding::UTF8;
  }

  // Create the response file.
  std::string responseFileNameFull =
    cmStrCat(this->TargetBuildDirectoryFull, '/', name);
  cmGeneratedFileStream responseStream(responseFileNameFull, false,
                                       responseEncoding);
  responseStream.SetCopyIfDifferent(true);
  responseStream << options << "\n";

  // Add a dependency so the target will rebuild when the set of
  // objects changes.
  makefile_depends.push_back(std::move(responseFileNameFull));

  // Construct the name to be used on the command line.
  std::string responseFileName =
    cmStrCat(this->TargetBuildDirectory, '/', name);
  return responseFileName;
}